

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

result_type __thiscall
math::wide_integer::uniform_int_distribution<48u,unsigned_short,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<48u,unsigned_short,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  ushort *puVar1;
  ushort *puVar2;
  short *psVar3;
  uint uVar4;
  unsigned_fast_type i;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  result_type range;
  undefined4 local_48;
  undefined2 local_44;
  undefined2 uStack_42;
  undefined4 local_40;
  undefined2 local_3c;
  undefined4 local_38;
  undefined2 local_34;
  undefined4 local_30;
  undefined2 local_2c;
  ushort local_28 [4];
  
  local_2c = 0;
  local_30 = 0;
  uVar6 = input_generator->_M_x;
  uVar4 = 0;
  bVar7 = 0;
  uVar5 = 0;
  lVar8 = 0;
  bVar9 = 0;
  do {
    if ((bVar9 & 3) == 0) {
      uVar5 = (uVar6 % 0xadc8) * 0xbc8f;
      uVar10 = (uVar6 / 0xadc8) * 0xd47;
      uVar6 = (uVar6 / 0xadc8) * -0xd47;
      if (uVar5 < uVar10) {
        uVar6 = uVar10 ^ 0x7fffffff;
      }
      uVar6 = uVar6 + uVar5;
      input_generator->_M_x = uVar6;
      uVar5 = uVar6;
    }
    *(ushort *)((long)&local_30 + lVar8) =
         *(ushort *)((long)&local_30 + lVar8) |
         (ushort)((uVar5 >> ((bVar9 & 3) << 3) & 0xff) << (bVar7 & 8));
    bVar9 = bVar9 + 1;
    lVar8 = lVar8 + (ulong)(uVar4 & 2);
    bVar7 = bVar7 + 8;
    uVar4 = uVar4 + 2;
  } while (lVar8 != 6);
  _local_44 = CONCAT22(uStack_42,
                       *(undefined2 *)
                        ((input_params->param_b).values.super_array<unsigned_char,_3UL>.elems + 1));
  local_48._0_3_ = input_params->param_a;
  local_48._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  local_3c = 0;
  local_40 = 0;
  lVar8 = 4;
  do {
    bVar7 = 0;
    if (lVar8 == -2) break;
    puVar1 = (ushort *)((long)&local_48 + lVar8);
    puVar2 = (ushort *)((long)&local_40 + lVar8);
    bVar7 = -(*puVar1 <= *puVar2) | 1;
    lVar8 = lVar8 + -2;
  } while (*puVar1 == *puVar2);
  if (bVar7 == 0) {
    local_34 = *(undefined2 *)
                (input_params[1].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
    local_38._0_3_ = input_params[1].param_a;
    local_38._3_1_ = input_params[1].param_b.values.super_array<unsigned_char,_3UL>.elems[0];
    local_28[2] = 0xffff;
    local_28[0] = 0xffff;
    local_28[1] = 0xffff;
    lVar8 = 4;
    do {
      bVar7 = 0;
      if (lVar8 == -2) break;
      puVar1 = (ushort *)((long)&local_38 + lVar8);
      puVar2 = (ushort *)((long)local_28 + lVar8);
      bVar7 = -(*puVar1 <= *puVar2) | 1;
      lVar8 = lVar8 + -2;
    } while (*puVar1 == *puVar2);
    if (bVar7 == 0) goto LAB_00148272;
  }
  local_34 = SUB62(*input_params,4);
  local_38 = SUB64(*input_params,0);
  local_44 = *(undefined2 *)
              (input_params[1].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
  local_48._0_3_ = input_params[1].param_a;
  local_48._3_1_ = input_params[1].param_b.values.super_array<unsigned_char,_3UL>.elems[0];
  lVar8 = 0;
  uVar6 = 0;
  do {
    uVar5 = (*(ushort *)((long)&local_48 + lVar8 * 2) - uVar6) -
            (uint)*(ushort *)((long)&local_38 + lVar8 * 2);
    uVar6 = (uint)(0xffff < uVar5);
    *(short *)((long)&local_48 + lVar8 * 2) = (short)uVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_3c = local_44;
  local_40 = local_48;
  lVar8 = 0;
  do {
    psVar3 = (short *)((long)&local_40 + lVar8);
    *psVar3 = *psVar3 + 1;
    if (*psVar3 != 0) break;
    bVar11 = lVar8 != 4;
    lVar8 = lVar8 + 2;
  } while (bVar11);
  local_44 = 0;
  local_48 = 0;
  uintwide_t<48U,_unsigned_short,_void,_false>::eval_divide_knuth
            ((uintwide_t<48U,_unsigned_short,_void,_false> *)&local_30,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_40,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_48);
  local_2c = local_44;
  local_30 = local_48;
  local_48._0_3_ = input_params->param_a;
  local_48._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  _local_44 = CONCAT22(uStack_42,
                       *(undefined2 *)
                        ((input_params->param_b).values.super_array<unsigned_char,_3UL>.elems + 1));
  uintwide_t<48U,_unsigned_short,_void,_false>::operator+=
            ((uintwide_t<48U,_unsigned_short,_void,_false> *)&local_30,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_48);
LAB_00148272:
  return (representation_type)(array<unsigned_char,_3UL>)SUB43(local_30,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }